

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
          (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> bits)

{
  int iVar1;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *this_00;
  
  this_00 = in_RDI;
  iVar1 = ::SafeInt::operator_cast_to_int(in_RDI);
  if (iVar1 < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x178b,
                  "SafeInt<T, E> &SafeInt<unsigned char>::operator<<=(SafeInt<U, E>) [T = unsigned char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = int]"
                 );
  }
  iVar1 = ::SafeInt::operator_cast_to_int(this_00);
  if (iVar1 < 8) {
    iVar1 = ::SafeInt::operator_cast_to_int(this_00);
    *(char *)&in_RDI->m_int = (char)in_RDI->m_int << ((byte)iVar1 & 0x1f);
    return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)in_RDI;
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x178c,
                "SafeInt<T, E> &SafeInt<unsigned char>::operator<<=(SafeInt<U, E>) [T = unsigned char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = int]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator <<=( SafeInt< U, E > bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int <<= (U)bits;
        return *this;
    }